

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::map_onto<double>
          (Omega_h *this,Read<signed_char> *a_data,LOs *a2b,LO nb,double init_val,Int width)

{
  int *piVar1;
  Alloc *pAVar2;
  _Alloc_hider _Var3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar8;
  uint uVar9;
  size_t sVar10;
  uint uVar11;
  uint uVar12;
  Read<signed_char> RVar13;
  Write<signed_char> out;
  string __str;
  string __str_1;
  Write<double> local_d8;
  string local_c0;
  Read<signed_char> *local_a0;
  Write<double> local_98;
  LOs local_88;
  Read<signed_char> local_78;
  Write<signed_char> local_68;
  LOs *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_a0 = (Read<signed_char> *)init_val;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  Write<double>::Write(&local_d8,nb * width,(double)local_a0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (((ulong)local_d8.shared_alloc_.alloc & 1) == 0) {
    uVar6 = (local_d8.shared_alloc_.alloc)->size;
  }
  else {
    uVar6 = (ulong)local_d8.shared_alloc_.alloc >> 3;
  }
  pAVar2 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar7 = pAVar2->size;
  }
  else {
    uVar7 = (ulong)pAVar2 >> 3;
  }
  if ((int)(uVar6 >> 3) < (int)(uVar7 >> 3)) {
    if (((ulong)local_d8.shared_alloc_.alloc & 1) == 0) {
      uVar6 = (local_d8.shared_alloc_.alloc)->size;
    }
    else {
      uVar6 = (ulong)local_d8.shared_alloc_.alloc >> 3;
    }
    uVar9 = (uint)(uVar6 >> 3);
    uVar11 = -uVar9;
    if (0 < (int)uVar9) {
      uVar11 = uVar9;
    }
    uVar12 = 1;
    if (9 < uVar11) {
      uVar6 = (ulong)uVar11;
      uVar4 = 4;
      do {
        uVar12 = uVar4;
        uVar5 = (uint)uVar6;
        if (uVar5 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_0030adac;
        }
        if (uVar5 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_0030adac;
        }
        if (uVar5 < 10000) goto LAB_0030adac;
        uVar6 = uVar6 / 10000;
        uVar4 = uVar12 + 4;
      } while (99999 < uVar5);
      uVar12 = uVar12 + 1;
    }
LAB_0030adac:
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_58 = a2b;
    std::__cxx11::string::_M_construct((ulong)&local_c0,(char)-((int)uVar9 >> 0x1f) + (char)uVar12);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_c0._M_dataplus._M_p + (uint)-((int)uVar9 >> 0x1f),uVar12,uVar11);
    _Var3._M_p = local_c0._M_dataplus._M_p;
    pAVar2 = (a_data->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      uVar6 = pAVar2->size;
    }
    else {
      uVar6 = (ulong)pAVar2 >> 3;
    }
    uVar9 = (uint)(uVar6 >> 3);
    uVar11 = -uVar9;
    if (0 < (int)uVar9) {
      uVar11 = uVar9;
    }
    uVar12 = 1;
    if (9 < uVar11) {
      uVar7 = (ulong)uVar11;
      uVar4 = 4;
      do {
        uVar12 = uVar4;
        uVar5 = (uint)uVar7;
        if (uVar5 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_0030ae59;
        }
        if (uVar5 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_0030ae59;
        }
        if (uVar5 < 10000) goto LAB_0030ae59;
        uVar7 = uVar7 / 10000;
        uVar4 = uVar12 + 4;
      } while (99999 < uVar5);
      uVar12 = uVar12 + 1;
    }
LAB_0030ae59:
    local_50[0] = local_40;
    local_a0 = a_data;
    std::__cxx11::string::_M_construct
              ((ulong)local_50,(char)uVar12 - ((char)((uVar6 >> 3) >> 0x18) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar9 >> 0x1f) + (long)local_50[0]),uVar12,uVar11);
    printf("ERROR: !( %s %s %s ) : ! ( %s %s %s )\n","out.size()",">=","a_data.size()",_Var3._M_p,
           ">=",local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    a2b = local_58;
    a_data = local_a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  if (((ulong)local_d8.shared_alloc_.alloc & 1) == 0) {
    uVar6 = (local_d8.shared_alloc_.alloc)->size;
  }
  else {
    uVar6 = (ulong)local_d8.shared_alloc_.alloc >> 3;
  }
  local_78.write_.shared_alloc_.alloc = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)local_78.write_.shared_alloc_.alloc & 1) == 0) {
    sVar10 = (local_78.write_.shared_alloc_.alloc)->size;
  }
  else {
    sVar10 = (ulong)local_78.write_.shared_alloc_.alloc >> 3;
  }
  if ((int)(sVar10 >> 3) <= (int)(uVar6 >> 3)) {
    if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.write_.shared_alloc_.alloc =
             (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.write_.shared_alloc_.alloc)->use_count =
             (local_78.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.write_.shared_alloc_.direct_ptr = (a_data->write_).shared_alloc_.direct_ptr;
    local_88.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
    if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88.write_.shared_alloc_.alloc =
             (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_88.write_.shared_alloc_.alloc)->use_count =
             (local_88.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_88.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
    local_68.shared_alloc_.alloc = local_d8.shared_alloc_.alloc;
    if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
        local_d8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.shared_alloc_.alloc = (Alloc *)((local_d8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_d8.shared_alloc_.alloc)->use_count = (local_d8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.shared_alloc_.direct_ptr = local_d8.shared_alloc_.direct_ptr;
    map_into<double>(&local_78,&local_88,&local_68,width);
    pAVar2 = local_68.shared_alloc_.alloc;
    if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
        local_68.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_88.write_.shared_alloc_.alloc;
    if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_78.write_.shared_alloc_.alloc;
    if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_78.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    local_98.shared_alloc_.alloc = local_d8.shared_alloc_.alloc;
    local_98.shared_alloc_.direct_ptr = local_d8.shared_alloc_.direct_ptr;
    if ((((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
         local_d8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_d8.shared_alloc_.alloc)->use_count = (local_d8.shared_alloc_.alloc)->use_count + -1;
      local_98.shared_alloc_.alloc = (Alloc *)((local_d8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_d8.shared_alloc_.alloc = (Alloc *)0x0;
    local_d8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<double>::Read((Read<signed_char> *)this,&local_98);
    pAVar2 = local_98.shared_alloc_.alloc;
    pvVar8 = extraout_RDX;
    if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 &&
        local_98.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_98.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_98.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar8 = extraout_RDX_00;
      }
    }
    pAVar2 = local_d8.shared_alloc_.alloc;
    if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
        local_d8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_d8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d8.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar8 = extraout_RDX_01;
      }
    }
    RVar13.write_.shared_alloc_.direct_ptr = pvVar8;
    RVar13.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar13.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","(out.size()) >= (a_data.size())",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x45);
}

Assistant:

Read<T> map_onto(Read<T> a_data, LOs a2b, LO nb, T init_val, Int width) {
  auto out = Write<T>(nb * width, init_val);
  OMEGA_H_CHECK_OP(out.size(), >=, a_data.size());
  map_into(a_data, a2b, out, width);
  return out;
}